

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

void Cba_ManWriteFonRange(Cba_Ntk_t *p,int iFon)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Vec_Str_t *p_00;
  uint uVar6;
  
  if (iFon < 1) {
    return;
  }
  p_00 = &p->pDesign->vOut;
  iVar2 = Cba_FonRangeSize(p,iFon);
  if (iVar2 == 1) {
    if ((p->vFonRange).nSize < 1) {
      uVar3 = 0;
    }
    else {
      uVar3 = Vec_IntGetEntry(&p->vFonRange,iFon);
    }
    if ((int)uVar3 < 0) goto LAB_003ee98e;
    if (uVar3 < 2) {
      return;
    }
    pVVar1 = p->pDesign->vHash->vObjs;
    uVar3 = uVar3 * 2 & 0xfffffffc;
    if (pVVar1->nSize <= (int)uVar3) goto LAB_003ee9ad;
    if (pVVar1->pArray[(ulong)uVar3 + 1] == 0) {
      return;
    }
  }
  if ((p->vFonRange).nSize < 1) {
    uVar3 = 0;
  }
  else {
    uVar3 = Vec_IntGetEntry(&p->vFonRange,iFon);
  }
  if ((int)uVar3 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  if ((uVar3 & 1) != 0) {
    Vec_StrPrintF(p_00,"signed ");
  }
  if ((p->vFonRange).nSize < 1) {
    uVar3 = 0;
  }
  else {
    uVar3 = Vec_IntGetEntry(&p->vFonRange,iFon);
  }
  if (-1 < (int)uVar3) {
    uVar4 = 0;
    uVar6 = 0;
    if (1 < uVar3) {
      pVVar1 = p->pDesign->vHash->vObjs;
      uVar3 = uVar3 * 2 & 0xfffffffc;
      if (pVVar1->nSize <= (int)uVar3) goto LAB_003ee9ad;
      uVar6 = pVVar1->pArray[uVar3];
    }
    if (0 < (p->vFonRange).nSize) {
      uVar4 = Vec_IntGetEntry(&p->vFonRange,iFon);
    }
    if (-1 < (int)uVar4) {
      uVar5 = 0;
      if (1 < uVar4) {
        pVVar1 = p->pDesign->vHash->vObjs;
        uVar3 = uVar4 * 2 & 0xfffffffc;
        if (pVVar1->nSize <= (int)uVar3) {
LAB_003ee9ad:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar5 = (ulong)(uint)pVVar1->pArray[(ulong)uVar3 + 1];
      }
      Vec_StrPrintF(p_00,"[%d:%d] ",(ulong)uVar6,uVar5);
      return;
    }
  }
LAB_003ee98e:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

void Cba_ManWriteFonRange( Cba_Ntk_t * p, int iFon )
{
    Vec_Str_t * vStr = &p->pDesign->vOut;
    if ( !iFon || Cba_FonIsConst(iFon) || (Cba_FonRangeSize(p, iFon) == 1 && Cba_FonRight(p, iFon) == 0) )
        return;
    if ( Cba_FonSigned(p, iFon) )
        Vec_StrPrintF( vStr, "signed " );
    Vec_StrPrintF( vStr, "[%d:%d] ", Cba_FonLeft(p, iFon), Cba_FonRight(p, iFon) );
}